

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icuinfo.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  UBool UVar1;
  FILE *__stream;
  FILE *out;
  UBool didSomething;
  char **ppcStack_18;
  UErrorCode errorCode;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  out._4_4_ = U_ZERO_ERROR;
  out._3_1_ = '\0';
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  argv_local._0_4_ = u_parseArgs(argc,argv,8,options);
  if ((int)argv_local < 0) {
    fprintf(_stderr,"error in command line argument \"%s\"\n",ppcStack_18[-(int)argv_local]);
  }
  if ((options[0].doesOccur == '\0') && (options[1].doesOccur == '\0')) {
    if (options[2].doesOccur != '\0') {
      u_setDataDirectory_63(options[2].value);
    }
    if (options[5].doesOccur != '\0') {
      cmd_millis();
      out._3_1_ = '\x01';
    }
    if (options[4].doesOccur != '\0') {
      cmd_listplugins();
      out._3_1_ = '\x01';
    }
    if (options[3].doesOccur != '\0') {
      cmd_version('\0',(UErrorCode *)((long)&out + 4));
      out._3_1_ = '\x01';
    }
    if (options[7].doesOccur != '\0') {
      __stream = fopen(options[7].value,"w");
      if (__stream == (FILE *)0x0) {
        fprintf(_stderr,"ERR: can\'t write to XML file %s\n",options[7].value);
        return 1;
      }
      fprintf(__stream,"<?xml version=\"1.0\" encoding=\"UTF-8\" ?>\n");
      udbg_writeIcuInfo((FILE *)__stream);
      fclose(__stream);
      out._3_1_ = '\x01';
    }
    if (options[6].doesOccur != '\0') {
      cmd_cleanup();
      out._3_1_ = '\x01';
    }
    if (out._3_1_ == '\0') {
      cmd_version('\0',(UErrorCode *)((long)&out + 4));
    }
    UVar1 = U_FAILURE(out._4_4_);
    argv_local._4_4_ = (uint)UVar1;
  }
  else {
    fprintf(_stderr,"%s: Output information about the current ICU\n",*ppcStack_18);
    fprintf(_stderr,
            "Options:\n -h     or  --help                 - Print this help message.\n -m     or  --millisecond-time     - Print the current UTC time in milliseconds.\n -d <dir>   or  --icudatadir <dir> - Set the ICU Data Directory\n -v                                - Print version and configuration information about ICU\n -K         or  --cleanup          - Call u_cleanup() before exitting (will attempt to unload plugins)\n\nIf no arguments are given, the tool will print ICU version and configuration information.\n"
           );
    fprintf(_stderr,"International Components for Unicode %s\n%s\n","63.1",
            " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
           );
    argv_local._4_4_ = (uint)((int)argv_local < 0);
  }
  return argv_local._4_4_;
}

Assistant:

extern int
main(int argc, char* argv[]) {
    UErrorCode errorCode = U_ZERO_ERROR;
    UBool didSomething = FALSE;
    
    /* preset then read command line options */
    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);

    /* error handling, printing usage message */
    if(argc<0) {
        fprintf(stderr,
            "error in command line argument \"%s\"\n",
            argv[-argc]);
    }
    if( options[0].doesOccur || options[1].doesOccur) {
      fprintf(stderr, "%s: Output information about the current ICU\n", argv[0]);
      fprintf(stderr, "Options:\n"
              " -h     or  --help                 - Print this help message.\n"
              " -m     or  --millisecond-time     - Print the current UTC time in milliseconds.\n"
              " -d <dir>   or  --icudatadir <dir> - Set the ICU Data Directory\n"
              " -v                                - Print version and configuration information about ICU\n"
#if UCONFIG_ENABLE_PLUGINS
              " -L         or  --list-plugins     - List and diagnose issues with ICU Plugins\n"
#endif
              " -K         or  --cleanup          - Call u_cleanup() before exitting (will attempt to unload plugins)\n"
              "\n"
              "If no arguments are given, the tool will print ICU version and configuration information.\n"
              );
      fprintf(stderr, "International Components for Unicode %s\n%s\n", U_ICU_VERSION, U_COPYRIGHT_STRING );
      return argc<0 ? U_ILLEGAL_ARGUMENT_ERROR : U_ZERO_ERROR;
    }
    
    if(options[2].doesOccur) {
      u_setDataDirectory(options[2].value);
    }

    if(options[5].doesOccur) {
      cmd_millis();
      didSomething=TRUE;
    } 
    if(options[4].doesOccur) {
      cmd_listplugins();
      didSomething = TRUE;
    }

    if(options[3].doesOccur) {
      cmd_version(FALSE, errorCode);
      didSomething = TRUE;
    }

    if(options[7].doesOccur) {  /* 2nd part of version: cleanup */
      FILE *out = fopen(options[7].value, "w");
      if(out==NULL) {
        fprintf(stderr,"ERR: can't write to XML file %s\n", options[7].value);
        return 1;
      }
      /* todo: API for writing DTD? */
      fprintf(out, "<?xml version=\"1.0\" encoding=\"UTF-8\" ?>\n");
      udbg_writeIcuInfo(out);
      fclose(out);
      didSomething = TRUE;
    }

    if(options[6].doesOccur) {  /* 2nd part of version: cleanup */
      cmd_cleanup();
      didSomething = TRUE;
    }

    if(!didSomething) {
      cmd_version(FALSE, errorCode);  /* at least print the version # */
    }

    return U_FAILURE(errorCode);
}